

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_el.h
# Opt level: O0

string * __thiscall lf::base::RefEl::ToString_abi_cxx11_(string *__return_storage_ptr__,RefEl *this)

{
  runtime_error *this_00;
  string local_228;
  allocator<char> local_201;
  string local_200;
  allocator<char> local_1d9;
  string local_1d8;
  stringstream local_1b8 [8];
  stringstream ss;
  ostream local_1a8 [377];
  allocator<char> local_2f;
  allocator<char> local_2e;
  allocator<char> local_2d [20];
  allocator<char> local_19;
  RefEl *local_18;
  RefEl *this_local;
  
  local_18 = this;
  this_local = (RefEl *)__return_storage_ptr__;
  switch(this->type_) {
  case kPoint:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"NODE",&local_19);
    std::allocator<char>::~allocator(&local_19);
    break;
  case kSegment:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"EDGE",local_2d);
    std::allocator<char>::~allocator(local_2d);
    break;
  case kTria:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"TRIA",&local_2e);
    std::allocator<char>::~allocator(&local_2e);
    break;
  case kQuad:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"QUAD",&local_2f);
    std::allocator<char>::~allocator(&local_2f);
    break;
  default:
    std::__cxx11::stringstream::stringstream(local_1b8);
    std::operator<<(local_1a8,"ToString() not implemented for this RefElType");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d8,"false",&local_1d9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_200,
               "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/base/ref_el.h"
               ,&local_201);
    std::__cxx11::stringstream::str();
    AssertionFailed(&local_1d8,&local_200,0x1d5,&local_228);
    std::__cxx11::string::~string((string *)&local_228);
    std::__cxx11::string::~string((string *)&local_200);
    std::allocator<char>::~allocator(&local_201);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::allocator<char>::~allocator(&local_1d9);
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"this code should not be reached");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard]] std::string ToString() const {
    switch (type_) {
      case RefElType::kPoint:
        return "NODE";
      case RefElType::kSegment:
        return "EDGE";
      case RefElType::kTria:
        return "TRIA";
      case RefElType::kQuad:
        return "QUAD";
      default:
        LF_VERIFY_MSG(false, "ToString() not implemented for this RefElType");
    }
  }